

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O2

Var Js::ProfilingHelpers::ProfiledLdElem
              (Var base,Var varIndex,FunctionBody *functionBody,ProfileId profileId,
              bool didArrayAccessHelperCall,bool bailedOutOnArraySpecialization)

{
  Type TVar1;
  long lVar2;
  SparseArraySegmentBase *pSVar3;
  code *pcVar4;
  PropertyRecordUsageCache *functionBody_00;
  bool bVar5;
  FldInfoFlags oldFlags;
  FldInfoFlags newFlags;
  bool expectingVarArray;
  ObjectType OVar6;
  uint uVar7;
  int iVar8;
  undefined4 *puVar9;
  JavascriptArray *pJVar10;
  ScriptContext *pSVar11;
  Var var;
  DynamicProfileInfo *pDVar12;
  INT_PTR IVar13;
  RecyclableObject *recyclableObject;
  undefined6 in_register_0000000a;
  FunctionBody *this;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_60;
  undefined6 uStack_5e;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_50;
  undefined2 uStack_4e;
  undefined4 uStack_4c;
  RecyclableObject *cacheOwner;
  undefined4 local_40;
  TypeId arrayTypeId;
  undefined1 local_38;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_36;
  anon_union_2_4_ea848c7b_for_ValueType_13 aStack_34;
  bool isObjectWithArray;
  ValueType arrayType;
  LdElemInfo ldElemInfo;
  
  local_40 = (undefined4)CONCAT62(in_register_0000000a,profileId);
  propertyRecordUsageCache = (PropertyRecordUsageCache *)functionBody;
  if (base == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x13,"(base)","base");
    if (!bVar5) goto LAB_009d99ce;
    *puVar9 = 0;
  }
  if (varIndex == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x14,"(varIndex)","varIndex");
    if (!bVar5) goto LAB_009d99ce;
    *puVar9 = 0;
  }
  if (propertyRecordUsageCache == (PropertyRecordUsageCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x15,"(functionBody)","functionBody");
    if (!bVar5) goto LAB_009d99ce;
    *puVar9 = 0;
  }
  if ((ProfileId)local_40 == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x16,"(profileId != Constants::NoProfileId)",
                                "profileId != Constants::NoProfileId");
    if (!bVar5) goto LAB_009d99ce;
    *puVar9 = 0;
  }
  LdElemInfo::LdElemInfo((LdElemInfo *)&local_36.field_0);
  if (bailedOutOnArraySpecialization) {
    arrayType.field_0.bits._1_1_ = arrayType.field_0.bits._1_1_ | 4;
  }
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(base);
  bVar5 = TaggedNumber::Is(base);
  if ((!bVar5) && (*base == VirtualTableInfo<Js::JavascriptArray>::Address)) {
    pJVar10 = UnsafeVarTo<Js::JavascriptArray>(base);
    local_50.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::FromArray(Array,pJVar10,TypeIds_Array);
    local_36.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::ToLikely((ValueType *)&local_50.field_0);
    this = (FunctionBody *)propertyRecordUsageCache;
    pSVar11 = FunctionProxy::GetScriptContext((FunctionProxy *)propertyRecordUsageCache);
    var = ProfiledLdElem_FastPath(pJVar10,varIndex,pSVar11,(LdElemInfo *)&local_36.field_0);
    aStack_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::Merge((ValueType *)&stack0xffffffffffffffcc,var);
    pDVar12 = FunctionBody::GetDynamicProfileInfo(this);
    goto LAB_009d9982;
  }
  pJVar10 = JavascriptArray::GetArrayForArrayOrObjectWithArray
                      (base,(bool *)((long)&arrayTypeId + 1),(TypeId *)((long)&cacheOwner + 4));
  if (didArrayAccessHelperCall) {
    arrayType.field_0.bits._1_1_ = arrayType.field_0.bits._1_1_ | 2;
  }
  if (pJVar10 == (JavascriptArray *)0x0) {
    bVar5 = TypedArrayBase::TryGetLengthForOptimizedTypedArray
                      (base,(uint32 *)&local_50.bits,(TypeId *)((long)&cacheOwner + 4));
    if (bVar5) {
      lVar2 = *base;
      IVar13 = ValueType::GetVirtualTypedArrayVtable(cacheOwner._4_4_);
      local_60.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromTypeId(cacheOwner._4_4_,lVar2 == IVar13);
      local_36.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::ToLikely((ValueType *)&local_60.field_0);
      goto LAB_009d980a;
    }
    bVar5 = VarIs<Js::RecyclableObject>(base);
    if (bVar5) {
      recyclableObject = UnsafeVarTo<Js::RecyclableObject>(base);
      local_60.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromObject(recyclableObject);
      local_36.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::ToLikely((ValueType *)&local_60.field_0);
    }
  }
  else {
    if (arrayTypeId._1_1_ == 1) {
      local_50.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromObjectArray(pJVar10);
    }
    else {
      local_50.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromArray(Array,pJVar10,cacheOwner._4_4_);
    }
    local_36.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::ToLikely((ValueType *)&local_50.field_0);
    pSVar3 = (pJVar10->head).ptr;
    if (pSVar3->left != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                  ,0x4c,"(head->left == 0)","head->left == 0");
      if (!bVar5) {
LAB_009d99ce:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar9 = 0;
    }
    TVar1 = pSVar3->length;
    local_50.bits = (Type)TVar1;
    uStack_4e = (undefined2)(TVar1 >> 0x10);
LAB_009d980a:
    bVar5 = TaggedInt::Is(varIndex);
    if ((((!bVar5) || (uVar7 = TaggedInt::ToInt32(varIndex), (int)uVar7 < 0)) ||
        (CONCAT22(uStack_4e,local_50.bits) <= uVar7)) ||
       ((pJVar10 != (JavascriptArray *)0x0 &&
        (iVar8 = (*(pJVar10->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                   super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                   [0x77])(pJVar10,(ulong)uVar7), (char)iVar8 != '\0')))) {
      arrayType.field_0.bits._1_1_ = arrayType.field_0.bits._1_1_ | 2;
    }
  }
  pSVar11 = FunctionProxy::GetScriptContext((FunctionProxy *)propertyRecordUsageCache);
  bVar5 = JavascriptOperators::GetPropertyRecordUsageCache
                    (varIndex,pSVar11,(PropertyRecordUsageCache **)&local_60,
                     (RecyclableObject **)&local_50);
  if (bVar5) {
    arrayTypeId._2_2_ = TypeIds_Undefined >> 0x10;
    local_38 = 0;
    var = JavascriptOperators::GetElementIWithCache<true>
                    (base,(RecyclableObject *)CONCAT44(uStack_4c,CONCAT22(uStack_4e,local_50.bits)),
                     (PropertyRecordUsageCache *)CONCAT62(uStack_5e,local_60.bits),pSVar11,
                     (PropertyCacheOperationInfo *)((long)&arrayTypeId + 2));
    oldFlags = DynamicProfileInfo::FldInfoFlagsFromCacheType(arrayTypeId._2_1_);
    arrayType.field_0.bits._0_1_ = oldFlags;
    newFlags = DynamicProfileInfo::FldInfoFlagsFromSlotType(arrayTypeId._3_1_);
    arrayType.field_0.bits._0_1_ = DynamicProfileInfo::MergeFldInfoFlags(oldFlags,newFlags);
  }
  else {
    var = JavascriptOperators::OP_GetElementI(base,varIndex,pSVar11);
  }
  arrayTypeId._2_2_ = local_36.bits;
  bVar5 = ValueType::IsUninitialized((ValueType *)((long)&arrayTypeId + 2));
  functionBody_00 = propertyRecordUsageCache;
  if ((bVar5) && (arrayType.field_0.bits._0_1_ == '\0')) {
    pDVar12 = FunctionBody::GetDynamicProfileInfo((FunctionBody *)propertyRecordUsageCache);
    DynamicProfileInfo::RecordElementLoadAsProfiled
              (pDVar12,(FunctionBody *)functionBody_00,(ProfileId)local_40);
    return var;
  }
  if ((((pJVar10 != (JavascriptArray *)0x0) &&
       (bVar5 = ValueType::IsLikelyObject((ValueType *)((long)&arrayTypeId + 2)), bVar5)) &&
      (OVar6 = ValueType::GetObjectType((ValueType *)((long)&arrayTypeId + 2)), OVar6 == Array)) &&
     (bVar5 = ValueType::HasIntElements((ValueType *)((long)&arrayTypeId + 2)), !bVar5)) {
    bVar5 = ValueType::HasFloatElements((ValueType *)((long)&arrayTypeId + 2));
    expectingVarArray = ValueType::HasVarElements((ValueType *)((long)&arrayTypeId + 2));
    JavascriptOperators::UpdateNativeArrayProfileInfoToCreateVarArray
              (pJVar10,bVar5,expectingVarArray);
  }
  aStack_34.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ValueType::Merge(&ValueType::Uninitialized,var);
  this = (FunctionBody *)propertyRecordUsageCache;
  pDVar12 = FunctionBody::GetDynamicProfileInfo((FunctionBody *)propertyRecordUsageCache);
LAB_009d9982:
  DynamicProfileInfo::RecordElementLoad
            (pDVar12,this,(ProfileId)local_40,(LdElemInfo *)&local_36.field_0);
  return var;
}

Assistant:

Var ProfilingHelpers::ProfiledLdElem(
        const Var base,
        const Var varIndex,
        FunctionBody *const functionBody,
        const ProfileId profileId,
        bool didArrayAccessHelperCall,
        bool bailedOutOnArraySpecialization)
    {
        JIT_HELPER_REENTRANT_HEADER(ProfiledLdElem);
        Assert(base);
        Assert(varIndex);
        Assert(functionBody);
        Assert(profileId != Constants::NoProfileId);

        LdElemInfo ldElemInfo;

        if (bailedOutOnArraySpecialization)
        {
            ldElemInfo.disableAggressiveSpecialization = true;
        }

        // Only enable fast path if the javascript array is not cross site
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(base);
#endif
        const bool isJsArray = !TaggedNumber::Is(base) && VirtualTableInfo<JavascriptArray>::HasVirtualTable(base);
        const bool fastPath = isJsArray;
        if(fastPath)
        {
            JavascriptArray *const array = UnsafeVarTo<JavascriptArray>(base);
            ldElemInfo.arrayType = ValueType::FromArray(ObjectType::Array, array, TypeIds_Array).ToLikely();

            const Var element = ProfiledLdElem_FastPath(array, varIndex, functionBody->GetScriptContext(), &ldElemInfo);

            ldElemInfo.elemType = ldElemInfo.elemType.Merge(element);
            functionBody->GetDynamicProfileInfo()->RecordElementLoad(functionBody, profileId, ldElemInfo);
            return element;
        }

        Assert(!isJsArray);
        bool isObjectWithArray;
        TypeId arrayTypeId;
        JavascriptArray *const array =
            JavascriptArray::GetArrayForArrayOrObjectWithArray(base, &isObjectWithArray, &arrayTypeId);

        if (didArrayAccessHelperCall)
        {
            ldElemInfo.neededHelperCall = true;
        }

        do // while(false)
        {
            // The fast path is only for JavascriptArray and doesn't cover native arrays, objects with internal arrays, or typed
            // arrays, but we still need to profile the array

            uint32 headSegmentLength;
            if(array)
            {
                ldElemInfo.arrayType =
                    (
                        isObjectWithArray
                            ? ValueType::FromObjectArray(array)
                            : ValueType::FromArray(ObjectType::Array, array, arrayTypeId)
                    ).ToLikely();

                SparseArraySegmentBase *const head = array->GetHead();
                Assert(head->left == 0);
                headSegmentLength = head->length;
            }
            else if(TypedArrayBase::TryGetLengthForOptimizedTypedArray(base, &headSegmentLength, &arrayTypeId))
            {
                bool isVirtual = (VirtualTableInfoBase::GetVirtualTable(base) == ValueType::GetVirtualTypedArrayVtable(arrayTypeId));
                ldElemInfo.arrayType = ValueType::FromTypeId(arrayTypeId, isVirtual).ToLikely();
            }
            else if(Js::VarIs<Js::RecyclableObject>(base))
            {
                ldElemInfo.arrayType = ValueType::FromObject(Js::UnsafeVarTo<Js::RecyclableObject>(base)).ToLikely();
                break;
            }
            else
            {
                break;
            }

            if(!TaggedInt::Is(varIndex))
            {
                ldElemInfo.neededHelperCall = true;
                break;
            }

            const int32 index = TaggedInt::ToInt32(varIndex);
            const uint32 offset = index;
            if(index < 0 || offset >= headSegmentLength || (array && array->IsMissingHeadSegmentItem(offset)))
            {
                ldElemInfo.neededHelperCall = true;
                break;
            }
        } while(false);

        ScriptContext* scriptContext = functionBody->GetScriptContext();
        RecyclableObject* cacheOwner;
        PropertyRecordUsageCache* propertyRecordUsageCache;
        Var element = nullptr;
        if (JavascriptOperators::GetPropertyRecordUsageCache(varIndex, scriptContext, &propertyRecordUsageCache, &cacheOwner))
        {
            PropertyCacheOperationInfo operationInfo;
            element = JavascriptOperators::GetElementIWithCache<true /* ReturnOperationInfo */>(base, cacheOwner, propertyRecordUsageCache, scriptContext, &operationInfo);

            ldElemInfo.flags = DynamicProfileInfo::FldInfoFlagsFromCacheType(operationInfo.cacheType);
            ldElemInfo.flags = DynamicProfileInfo::MergeFldInfoFlags(ldElemInfo.flags, DynamicProfileInfo::FldInfoFlagsFromSlotType(operationInfo.slotType));
        }
        else
        {
            element = JavascriptOperators::OP_GetElementI(base, varIndex, scriptContext);
        }

        const ValueType arrayType(ldElemInfo.GetArrayType());
        if(!arrayType.IsUninitialized() || ldElemInfo.flags != Js::FldInfo_NoInfo)
        {
            if(array && arrayType.IsLikelyObject() && arrayType.GetObjectType() == ObjectType::Array && !arrayType.HasIntElements())
            {
                JavascriptOperators::UpdateNativeArrayProfileInfoToCreateVarArray(
                    array,
                    arrayType.HasFloatElements(),
                    arrayType.HasVarElements());
            }

            ldElemInfo.elemType = ValueType::Uninitialized.Merge(element);

            functionBody->GetDynamicProfileInfo()->RecordElementLoad(functionBody, profileId, ldElemInfo);
            return element;
        }

        functionBody->GetDynamicProfileInfo()->RecordElementLoadAsProfiled(functionBody, profileId);
        return element;
        JIT_HELPER_END(ProfiledLdElem);
    }